

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void Curl_hash_clean_with_criterium(Curl_hash *h,void *user,_func_int_void_ptr_void_ptr *comp)

{
  Curl_llist *pCVar1;
  Curl_llist_element *pCVar2;
  int iVar3;
  Curl_hash_element *he;
  int i;
  Curl_llist *list;
  Curl_llist_element *lnext;
  Curl_llist_element *le;
  _func_int_void_ptr_void_ptr *comp_local;
  void *user_local;
  Curl_hash *h_local;
  
  if (h != (Curl_hash *)0x0) {
    for (he._4_4_ = 0; he._4_4_ < h->slots; he._4_4_ = he._4_4_ + 1) {
      pCVar1 = h->table;
      pCVar2 = pCVar1[he._4_4_].head;
      while (lnext = pCVar2, lnext != (Curl_llist_element *)0x0) {
        pCVar2 = lnext->next;
        if ((comp == (_func_int_void_ptr_void_ptr *)0x0) ||
           (iVar3 = (*comp)(user,*(void **)((long)lnext->ptr + 0x18)), iVar3 != 0)) {
          Curl_llist_remove(pCVar1 + he._4_4_,lnext,h);
          h->size = h->size - 1;
        }
      }
    }
  }
  return;
}

Assistant:

void
Curl_hash_clean_with_criterium(struct Curl_hash *h, void *user,
                               int (*comp)(void *, void *))
{
  struct Curl_llist_element *le;
  struct Curl_llist_element *lnext;
  struct Curl_llist *list;
  int i;

  if(!h)
    return;

  for(i = 0; i < h->slots; ++i) {
    list = &h->table[i];
    le = list->head; /* get first list entry */
    while(le) {
      struct Curl_hash_element *he = le->ptr;
      lnext = le->next;
      /* ask the callback function if we shall remove this entry or not */
      if(!comp || comp(user, he->ptr)) {
        Curl_llist_remove(list, le, (void *) h);
        --h->size; /* one less entry in the hash now */
      }
      le = lnext;
    }
  }
}